

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void __thiscall
tcu::astc::anon_unknown_0::NormalBlockParams::NormalBlockParams(NormalBlockParams *this)

{
  NormalBlockParams *this_local;
  
  this->weightGridWidth = -1;
  this->weightGridHeight = -1;
  ISEParams::ISEParams(&this->weightISEParams,ISEMODE_LAST,-1);
  this->isDualPlane = true;
  this->ccs = 0xffffffff;
  this->numPartitions = -1;
  this->isMultiPartSingleCemMode = false;
  this->partitionSeed = 0xffffffff;
  this->colorEndpointModes[0] = 0;
  this->colorEndpointModes[1] = 0;
  this->colorEndpointModes[2] = 0;
  this->colorEndpointModes[3] = 0;
  return;
}

Assistant:

NormalBlockParams (void)
		: weightGridWidth			(-1)
		, weightGridHeight			(-1)
		, weightISEParams			(ISEMODE_LAST, -1)
		, isDualPlane				(true)
		, ccs						((deUint32)-1)
		, numPartitions				(-1)
		, isMultiPartSingleCemMode	(false)
		, partitionSeed				((deUint32)-1)
	{
		colorEndpointModes[0] = 0;
		colorEndpointModes[1] = 0;
		colorEndpointModes[2] = 0;
		colorEndpointModes[3] = 0;
	}